

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

exr_result_t internal_exr_validate_write_part(_internal_exr_context *f,_internal_exr_part *curpart)

{
  _internal_exr_context *in_RSI;
  _internal_exr_part *unaff_retaddr;
  undefined4 in_stack_00000008;
  exr_result_t rv;
  _internal_exr_part *in_stack_00000030;
  _internal_exr_context *in_stack_00000038;
  uint in_stack_ffffffffffffffe0;
  exr_result_t local_4;
  
  local_4 = validate_req_attr(f,curpart,rv);
  if ((((local_4 == 0) &&
       (local_4 = validate_image_dimensions(in_stack_00000038,in_stack_00000030), local_4 == 0)) &&
      (local_4 = validate_channels(f,curpart,(exr_attr_chlist_t *)CONCAT44(rv,in_stack_00000008)),
      local_4 == 0)) &&
     (((local_4 = validate_part_type(in_RSI,(_internal_exr_part *)(ulong)in_stack_ffffffffffffffe0),
       local_4 == 0 &&
       (local_4 = validate_tile_data((_internal_exr_context *)CONCAT44(rv,in_stack_00000008),
                                     unaff_retaddr), local_4 == 0)) &&
      (local_4 = validate_deep_data(in_RSI,(_internal_exr_part *)(ulong)in_stack_ffffffffffffffe0),
      local_4 == 0)))) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
internal_exr_validate_write_part (
    struct _internal_exr_context* f, struct _internal_exr_part* curpart)
{
    exr_result_t rv;

    rv = validate_req_attr (f, curpart, 0);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = validate_image_dimensions (f, curpart);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = validate_channels (f, curpart, curpart->channels->chlist);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = validate_part_type (f, curpart);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = validate_tile_data (f, curpart);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = validate_deep_data (f, curpart);
    if (rv != EXR_ERR_SUCCESS) return rv;

    return EXR_ERR_SUCCESS;
}